

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

uint32_t mp_decode_map(char **data)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar5 = (uint)data;
  pbVar3 = (byte *)*data;
  bVar1 = *pbVar3;
  *data = (char *)(pbVar3 + 1);
  if (bVar1 == 0xdf) {
    uVar5 = *(uint *)(pbVar3 + 1);
    *data = (char *)(pbVar3 + 5);
    return uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  }
  if (bVar1 == 0xde) {
    uVar2 = *(ushort *)(pbVar3 + 1);
    *data = (char *)(pbVar3 + 3);
    return (uint32_t)(ushort)(uVar2 << 8 | uVar2 >> 8);
  }
  if ((char)bVar1 < -0x70) {
    return bVar1 & 0xf;
  }
  mp_decode_map_cold_1();
  if (((0xf < uVar5 - 1) || (uVar4 = 2, mp_ext_hint[uVar5 - 1] == '\0')) &&
     (uVar4 = 3, 0xff < uVar5)) {
    return (uint)(0xffff < uVar5) * 2 + 4;
  }
  return uVar4;
}

Assistant:

MP_IMPL uint32_t
mp_decode_map(const char **data)
{
	uint8_t c = mp_load_u8(data);
	switch (c) {
	case 0xde:
		return mp_load_u16(data);
	case 0xdf:
		return mp_load_u32(data);
	default:
		if (mp_unlikely(c < 0x80 || c > 0x8f))
			mp_unreachable();
		return c & 0xf;
	}
}